

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O3

MatrixXd *
eigs_speed_test(MatrixXd *__return_storage_ptr__,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Nvec,size_t Nrepeats)

{
  unsigned_long uVar1;
  pointer puVar2;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *this;
  double *pdVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double elap_us;
  double maxeig;
  MatrixXd A;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_c0;
  double local_a0;
  long local_98;
  double local_90;
  double local_88;
  double *local_80;
  double *local_78;
  long local_70;
  MatrixXd *local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  void *local_48 [3];
  
  lVar4 = (long)(Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if (lVar4 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,lVar4 * 3,lVar4,3);
  puVar2 = (Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    local_a0 = (double)(long)Nrepeats;
    uVar6 = 0;
    do {
      local_80 = (double *)puVar2[uVar6];
      local_78 = local_80;
      if ((long)local_80 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_80);
      local_98 = std::chrono::_V2::system_clock::now();
      if (Nrepeats != 0) {
        sVar5 = 0;
        do {
          Eigen::internal::eigenvalues_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::
          run((eigenvalues_selector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_false> *)&local_80,
              (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
          if ((long)local_78 < 1) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                          ,0x19b,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
                         );
          }
          local_88 = *local_80;
          if (local_78 != (double *)0x1) {
            lVar4 = (long)local_78 + -1;
            dVar7 = local_88;
            pdVar3 = local_80;
            do {
              pdVar3 = pdVar3 + 2;
              local_88 = *pdVar3;
              if (dVar7 <= *pdVar3) {
                local_88 = dVar7;
              }
              lVar4 = lVar4 + -1;
              dVar7 = local_88;
            } while (lVar4 != 0);
          }
          free(local_80);
          sVar5 = sVar5 + 1;
        } while (sVar5 != Nrepeats);
      }
      lVar4 = std::chrono::_V2::system_clock::now();
      local_90 = (((double)(lVar4 - local_98) / 1000000000.0) / local_a0) * 1000000.0;
      pdVar3 = (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
      local_70 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
      local_80 = pdVar3 + uVar6;
      if (local_70 < 0 && pdVar3 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                     );
      }
      local_58 = 0;
      local_50 = 1;
      local_68 = __return_storage_ptr__;
      local_60 = uVar6;
      if ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows <= (long)uVar6) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      uVar1 = (Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      local_c0.m_row = 0;
      local_c0.m_col = 1;
      local_c0.m_currentBlockRows = 1;
      local_c0.m_xpr = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_80;
      if (local_70 < 1) {
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                      ,0x25,
                      "Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                     );
      }
      auVar8._8_4_ = (int)(uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      *local_80 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      this = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
             ::operator_(&local_c0,&local_90);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(this,&local_88);
      lVar4 = *(long *)((long)local_c0.m_xpr + 0x10);
      if (local_c0.m_currentBlockRows + local_c0.m_row != 1) {
        if (lVar4 != 0) goto LAB_00152dc2;
        lVar4 = 0;
      }
      if (local_c0.m_col != lVar4) {
LAB_00152dc2:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                      ,0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                     );
      }
      free(local_48[0]);
      uVar6 = uVar6 + 1;
      puVar2 = (Nvec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(Nvec->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd eigs_speed_test(std::vector<std::size_t> &Nvec, std::size_t Nrepeats) {
    Eigen::MatrixXd results(Nvec.size(), 3);
    for (std::size_t i = 0; i < Nvec.size(); ++i)
    {
        Eigen::MatrixXd A = Eigen::MatrixXd::Random(Nvec[i], Nvec[i]);
        double maxeig;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < Nrepeats; ++i) {
            maxeig = A.eigenvalues().real().minCoeff();
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / Nrepeats*1e6;
        results.row(i) << static_cast<double>(Nvec[i]), elap_us, maxeig;
    }
    return results;
}